

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.hpp
# Opt level: O2

void __thiscall
Diligent::BufferBase<Diligent::EngineVkImplTraits>::~BufferBase
          (BufferBase<Diligent::EngineVkImplTraits> *this)

{
  (this->
  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>).
  super_ObjectBase<Diligent::IBufferVk>.super_RefCountedObject<Diligent::IBufferVk>.super_IBufferVk.
  super_IBuffer.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_008913e0;
  if (this->m_DynamicBufferId != 0xffffffff) {
    RenderDeviceBase<Diligent::EngineVkImplTraits>::RecycleDynamicBufferId
              ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)
               (this->
               super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               ).m_pDevice,this->m_DynamicBufferId);
  }
  std::
  unique_ptr<Diligent::BufferViewVkImpl,_Diligent::STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>_>
  ::~unique_ptr(&this->m_pDefaultSRV);
  std::
  unique_ptr<Diligent::BufferViewVkImpl,_Diligent::STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>_>
  ::~unique_ptr(&this->m_pDefaultUAV);
  DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>::
  ~DeviceObjectBase(&this->
                     super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                   );
  return;
}

Assistant:

~BufferBase()
    {
        if (m_DynamicBufferId != ~0u)
        {
            this->m_pDevice->RecycleDynamicBufferId(m_DynamicBufferId);
        }
    }